

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O1

void NULLCDynamic::OverrideFunction(NULLCRef dest,NULLCRef src)

{
  uint uVar1;
  long lVar2;
  undefined8 in_RAX;
  char *pcVar3;
  long lVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                  ,0xf,"void NULLCDynamic::OverrideFunction(NULLCRef, NULLCRef)");
  }
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    lVar2 = *(long *)(linker + 0x200);
    lVar4 = (ulong)in_stack_00000008 * 0x50;
    if (*(int *)(lVar2 + 0x10 + lVar4) != 3) {
      pcVar3 = "Destination variable is not a function";
LAB_00124d54:
      nullcThrowError(pcVar3,&stack0x00000008,lVar4,in_RAX);
      return;
    }
    if (dest.ptr._4_4_ < *(uint *)(linker + 0x20c)) {
      if (*(int *)(lVar2 + 0x10 + (ulong)dest.ptr._4_4_ * 0x50) != 3) {
        pcVar3 = "Source variable is not a function";
        goto LAB_00124d54;
      }
      if (in_stack_00000008 == dest.ptr._4_4_) {
        nullcRedirectFunction
                  (*(uint *)(CONCAT44(dest.typeID,in_stack_0000000c) + 8),
                   *(uint *)(CONCAT44(src.typeID,in_stack_0000001c) + 8));
        return;
      }
      uVar1 = *(uint *)((ulong)dest.ptr._4_4_ * 0x50 + lVar2);
      if ((uVar1 < *(uint *)(linker + 0x29c)) &&
         (*(uint *)(lVar2 + lVar4) < *(uint *)(linker + 0x29c))) {
        nullcThrowError("Cannot convert from \'%s\' to \'%s\'",
                        (ulong)uVar1 + *(long *)(linker + 0x290),
                        (ulong)*(uint *)(lVar2 + lVar4) + *(long *)(linker + 0x290),in_RAX);
        return;
      }
      pcVar3 = 
      "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
      ;
      goto LAB_00124da6;
    }
  }
  pcVar3 = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00124da6:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,pcVar3);
}

Assistant:

void OverrideFunction(NULLCRef dest, NULLCRef src)
	{
		assert(linker);
		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}
		if(linker->exTypes[src.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Source variable is not a function");
			return;
		}
		if(dest.typeID != src.typeID)
		{
			nullcThrowError("Cannot convert from '%s' to '%s'", &linker->exSymbols[linker->exTypes[src.typeID].offsetToName], &linker->exSymbols[linker->exTypes[dest.typeID].offsetToName]);
			return;
		}

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, ((NULLCFuncPtr*)src.ptr)->id);
	}